

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::IsPathToFramework(string *path)

{
  bool bVar1;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    bVar1 = cmHasLiteralSuffix<std::__cxx11::string,11ul>(path,(char (*) [11])".framework");
    return bVar1;
  }
  return false;
}

Assistant:

bool cmSystemTools::IsPathToFramework(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".framework"));
}